

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall
QMenuBarPrivate::setCurrentAction
          (QMenuBarPrivate *this,QAction *action,bool popup,bool activateFirst)

{
  QPointer<QAction> *this_00;
  Data *pDVar1;
  QWidget *this_01;
  QWidget *this_02;
  bool bVar2;
  char cVar3;
  QAction *pQVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  QStatusTipEvent tip;
  undefined1 *puStack_80;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->currentAction).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar4 = (QAction *)0x0;
  }
  else {
    pQVar4 = (QAction *)(this->currentAction).wp.value;
  }
  if ((pQVar4 == action) && (((this->field_0x2a0 ^ popup) & 1) == 0)) goto LAB_0042bf96;
  QBasicTimer::stop();
  if (popup) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->activeMenu);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  this_00 = &this->currentAction;
  this->doChildEffects = bVar2;
  this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pDVar1 = (this->activeMenu).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     (this_02 = (QWidget *)(this->activeMenu).wp.value, this_02 == (QWidget *)0x0)) {
    pQVar5 = (QWidget *)0x0;
  }
  else {
    pQVar5 = (QWidget *)0x0;
    QWeakPointer<QObject>::assign<QObject>(&(this->activeMenu).wp,(QObject *)0x0);
    if (popup) {
      pQVar5 = QWidget::window(this_01);
      pQVar5 = QWidget::focusWidget(pQVar5);
      QWidget::setFocus(this_01,NoFocusReason);
    }
    QWidget::hide(this_02);
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QAction *)0x0;
    }
    else {
      pQVar4 = (QAction *)(this->currentAction).wp.value;
    }
    _tip = actionRect(this,pQVar4);
    QWidget::update(this_01,(QRect *)&tip);
  }
  this->field_0x2a0 = this->field_0x2a0 & 0xfe | popup;
  pDVar1 = (this->currentAction).wp.d;
  bVar2 = true;
  if ((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) {
    bVar2 = (this->currentAction).wp.value == (QObject *)0x0;
  }
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)action);
  if (action == (QAction *)0x0) {
LAB_0042bf27:
    if (!bVar2) {
      local_58.size = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      _tip = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_58);
      QCoreApplication::sendEvent(&this_01->super_QObject,(QEvent *)&tip);
      QStatusTipEvent::~QStatusTipEvent(&tip);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  else {
    cVar3 = QAction::isEnabled();
    if (cVar3 == '\0') goto LAB_0042bf27;
    activateAction(this,action,Hover);
    if (popup) {
      popupAction(this,action,activateFirst);
    }
    _tip = actionRect(this,action);
    QWidget::update(this_01,(QRect *)&tip);
  }
  if (pQVar5 != (QWidget *)0x0) {
    QWidget::setFocus(pQVar5,NoFocusReason);
  }
LAB_0042bf96:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::setCurrentAction(QAction *action, bool popup, bool activateFirst)
{
    if (currentAction == action && popup == popupState)
        return;

    autoReleaseTimer.stop();

    doChildEffects = (popup && !activeMenu);
    Q_Q(QMenuBar);
    QWidget *fw = nullptr;
    if (QMenu *menu = activeMenu) {
        activeMenu = nullptr;
        if (popup) {
            fw = q->window()->focusWidget();
            q->setFocus(Qt::NoFocusReason);
        }
        menu->hide();
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    popupState = popup;
#if QT_CONFIG(statustip)
    QAction *previousAction = currentAction;
#endif
    currentAction = action;
    if (action && action->isEnabled()) {
        activateAction(action, QAction::Hover);
        if (popup)
            popupAction(action, activateFirst);
        q->update(actionRect(action));
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        QString empty;
        QStatusTipEvent tip(empty);
        QCoreApplication::sendEvent(q, &tip);
#endif
    }
    if (fw)
        fw->setFocus(Qt::NoFocusReason);
}